

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O0

int __thiscall mp::Error::init(Error *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  undefined1 in_stack_000001f8 [16];
  CStringRef in_stack_00000208;
  string *in_stack_ffffffffffffff98;
  Error *in_stack_ffffffffffffffa0;
  string local_40 [32];
  Error *local_20;
  EVP_PKEY_CTX *local_8;
  
  local_20 = this;
  local_8 = ctx;
  fmt::format_abi_cxx11_(in_stack_00000208,(ArgList)in_stack_000001f8);
  SetMessage(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  iVar1 = std::__cxx11::string::~string(local_40);
  return iVar1;
}

Assistant:

void init(fmt::CStringRef format_str, fmt::ArgList args) {
    SetMessage(fmt::format(format_str, args));
  }